

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

void __thiscall level_mesh::collect_mu_models(level_mesh *this,size_t num_mu_instances)

{
  bool bVar1;
  reference ppbVar2;
  b_model local_88;
  b_model local_78;
  __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
  local_68;
  uint16_t local_5a;
  size_t sStack_58;
  uint16_t model_id;
  size_t instance0;
  size_t num_instances;
  b_model_instance **local_40;
  b_model_instance **local_38;
  __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
  local_30;
  b_model_instance_vec_it end;
  b_model_instance_vec_it it;
  b_model_instance_vec_it it0;
  size_t num_mu_instances_local;
  level_mesh *this_local;
  
  if (num_mu_instances != 0) {
    end._M_current =
         (b_model_instance **)
         std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::begin
                   (&this->m_instances);
    it._M_current = end._M_current;
    local_40 = (b_model_instance **)
               __gnu_cxx::
               __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
               ::operator+(&end,num_mu_instances);
    local_38 = end._M_current;
    local_30 = (__normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
                )local_40;
    std::
    sort<__gnu_cxx::__normal_iterator<b_model_instance**,std::vector<b_model_instance*,std::allocator<b_model_instance*>>>,model_id_pred>
              (end._M_current);
    instance0 = 1;
    sStack_58 = 0;
    local_68 = __gnu_cxx::
               __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
               ::operator++(&end,0);
    ppbVar2 = __gnu_cxx::
              __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
              ::operator*(&local_68);
    local_5a = (*ppbVar2)->model_id;
    while (bVar1 = __gnu_cxx::operator!=(&end,&local_30), bVar1) {
      ppbVar2 = __gnu_cxx::
                __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
                ::operator*(&end);
      if ((*ppbVar2)->model_id != local_5a) {
        b_model::b_model(&local_78,MT_MU_MODEL,instance0,sStack_58);
        std::vector<b_model,_std::allocator<b_model>_>::push_back(&this->m_models,&local_78);
        ppbVar2 = __gnu_cxx::
                  __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
                  ::operator*(&end);
        local_5a = (*ppbVar2)->model_id;
        sStack_58 = __gnu_cxx::operator-(&end,&it);
        instance0 = 0;
      }
      __gnu_cxx::
      __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
      ::operator++(&end);
      instance0 = instance0 + 1;
    }
    b_model::b_model(&local_88,MT_MU_MODEL,instance0,sStack_58);
    std::vector<b_model,_std::allocator<b_model>_>::push_back(&this->m_models,&local_88);
  }
  return;
}

Assistant:

void level_mesh::collect_mu_models(size_t num_mu_instances)
{
	if (num_mu_instances) {
		b_model_instance_vec_it it0 = m_instances.begin(), it = it0, end = it + num_mu_instances;
		std::sort(it, end, model_id_pred());
		size_t num_instances = 1, instance0 = 0;
		for (uint16_t model_id = (*it++)->model_id; it != end; ++it, ++num_instances) {
			if ((*it)->model_id == model_id)
				continue;
			m_models.push_back(b_model(b_model::MT_MU_MODEL, num_instances, instance0));
			model_id = (*it)->model_id;
			instance0 = it - it0;
			num_instances = 0;
		}
		m_models.push_back(b_model(b_model::MT_MU_MODEL, num_instances, instance0));
	}
}